

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-default-aes-impl.c
# Opt level: O3

int ndn_lite_default_aes_cbc_decrypt
              (uint8_t *input_value,uint32_t input_size,uint8_t *output_value,uint32_t *output_size,
              uint8_t *aes_iv,abstract_aes_key *aes_key)

{
  uint outlen;
  uint8_t *in;
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  undefined8 uStack_100;
  undefined1 local_f8 [8];
  tc_aes_key_sched_struct schedule;
  
  iVar5 = -0x1b;
  if (0xf < aes_key->key_size) {
    schedule.words._168_8_ = local_f8;
    outlen = input_size + 0x10;
    uVar6 = (ulong)outlen + 0xf & 0xfffffffffffffff0;
    lVar1 = -uVar6;
    lVar7 = -uVar6;
    uVar2 = *(undefined8 *)(aes_iv + 8);
    *(undefined8 *)(local_f8 + lVar7) = *(undefined8 *)aes_iv;
    *(undefined8 *)((long)&schedule + lVar7) = uVar2;
    in = (uint8_t *)((long)&schedule + lVar1 + 8);
    *(undefined8 *)((long)&uStack_100 + lVar1) = 0x116775;
    memcpy(in,input_value,(ulong)input_size);
    *(undefined8 *)((long)&uStack_100 + lVar1) = 0x116784;
    iVar3 = tc_aes128_set_decrypt_key((TCAesKeySched_t)local_f8,aes_key->key_value);
    iVar5 = -0x1c;
    if (iVar3 == 1) {
      *(undefined8 *)((long)&uStack_100 + lVar1) = 0x1167ac;
      iVar3 = tc_cbc_mode_decrypt(output_value,outlen,in,outlen,local_f8 + lVar1,
                                  (TCAesKeySched_t)local_f8);
      iVar5 = -0x19;
      if (iVar3 == 1) {
        *(undefined8 *)((long)&uStack_100 + lVar1) = 0x1167c4;
        uVar4 = ndn_lite_default_aes_parse_unpadding_size(output_value,input_size);
        *output_size = uVar4;
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int
ndn_lite_default_aes_cbc_decrypt(const uint8_t* input_value, uint32_t input_size,
                                 uint8_t* output_value, uint32_t* output_size,
                                 const uint8_t* aes_iv, const struct abstract_aes_key* aes_key)
{
  if (aes_key->key_size < NDN_SEC_AES_MIN_KEY_SIZE) {
    return NDN_SEC_WRONG_AES_SIZE;
  }
  uint8_t final_input[TC_AES_BLOCK_SIZE + input_size];
  memcpy(final_input, aes_iv, TC_AES_BLOCK_SIZE);
  memcpy(final_input + TC_AES_BLOCK_SIZE, input_value, input_size);
  struct tc_aes_key_sched_struct schedule;
  if (tc_aes128_set_decrypt_key(&schedule, aes_key->key_value) != TC_CRYPTO_SUCCESS) {
    return NDN_SEC_INIT_FAILURE;
  }
  // Tinycrypt requires: in == iv + ciphertext, i.e. the iv and the ciphertext are contiguous.
  if (tc_cbc_mode_decrypt(output_value, sizeof(final_input), // output_value, input_size, //
                          final_input + TC_AES_BLOCK_SIZE, sizeof(final_input), //input_value, input_size, 
                          final_input, &schedule) != TC_CRYPTO_SUCCESS) {
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  }
  *output_size = ndn_lite_default_aes_parse_unpadding_size(output_value, input_size);
  return NDN_SUCCESS;
}